

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O0

void mathCore::recursive_idempotent(expression *a)

{
  bool bVar1;
  reference ppeVar2;
  _Self local_58;
  _Self local_50;
  iterator iter;
  expression *child;
  expSet tempSet;
  expression *a_local;
  
  tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)a;
  idempotent_law(a);
  universal_bound((expression *)tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
            ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child);
  local_50._M_node =
       (_Base_ptr)
       std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                 ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                  (tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                   ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                    (tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_50);
    iter._M_node = (_Base_ptr)*ppeVar2;
    local_50._M_node =
         (_Base_ptr)
         std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                   ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                    (tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 8),local_50._M_node)
    ;
    recursive_idempotent((expression *)iter._M_node);
    std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
              ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child,
               (value_type *)&iter);
  }
  mergeMultiSet((expSet *)(tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 8),
                (expSet *)&child);
  idempotent_law((expression *)tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  universal_bound((expression *)tempSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
            ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child);
  return;
}

Assistant:

void mathCore::recursive_idempotent(expression* a) {
	mathCore::idempotent_law(a);
	mathCore::universal_bound(a);

	// We simplify first, because it might help stop recursion

	expSet tempSet;
	expression* child;
	auto iter = a->contents.begin();

	
	while (iter != a->contents.end()) {
		child = *iter;
		iter = a->contents.erase(iter);

		recursive_idempotent(child);
		tempSet.insert(child);
	}

	mergeMultiSet(a->contents, tempSet);

	mathCore::idempotent_law(a);
	mathCore::universal_bound(a);

	// We simplify After, because one of our children might have changed!
}